

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::containsNone(UnicodeSet *this,UChar32 start,UChar32 end)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = findCodePoint(this,start);
  if ((uVar2 & 1) == 0) {
    bVar1 = end < this->list[(int)uVar2];
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

UBool UnicodeSet::containsNone(UChar32 start, UChar32 end) const {
    //int32_t i = -1;
    //for (;;) {
    //    if (start < list[++i]) break;
    //}
    int32_t i = findCodePoint(start);
    return ((i & 1) == 0 && end < list[i]);
}